

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O1

int __thiscall ncnn::Normalize::load_model(Normalize *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *__ptr;
  Allocator *pAVar3;
  int iVar4;
  void *local_58;
  int *piStack_50;
  size_t local_48;
  int local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  size_t local_20;
  
  (*mb->_vptr_ModelBin[2])(&local_58,mb,(ulong)(uint)this->scale_data_size);
  pMVar1 = &this->scale_data;
  if (pMVar1 != (Mat *)&local_58) {
    if (piStack_50 != (int *)0x0) {
      LOCK();
      *piStack_50 = *piStack_50 + 1;
      UNLOCK();
    }
    piVar2 = (this->scale_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        __ptr = (this->scale_data).data;
        pAVar3 = (this->scale_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scale_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->scale_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->scale_data).refcount = (int *)0x0;
    (this->scale_data).dims = 0;
    (this->scale_data).w = 0;
    (this->scale_data).h = 0;
    (this->scale_data).c = 0;
    (this->scale_data).cstep = 0;
    (this->scale_data).data = local_58;
    (this->scale_data).refcount = piStack_50;
    (this->scale_data).elemsize = local_48;
    (this->scale_data).elempack = local_40;
    (this->scale_data).allocator = local_38;
    (this->scale_data).dims = local_30;
    (this->scale_data).w = iStack_2c;
    (this->scale_data).h = iStack_28;
    (this->scale_data).c = iStack_24;
    (this->scale_data).cstep = local_20;
  }
  if (piStack_50 != (int *)0x0) {
    LOCK();
    *piStack_50 = *piStack_50 + -1;
    UNLOCK();
    if (*piStack_50 == 0) {
      if (local_38 == (Allocator *)0x0) {
        if (local_58 != (void *)0x0) {
          free(local_58);
        }
      }
      else {
        (**(code **)(*(long *)local_38 + 0x18))();
      }
    }
  }
  if (pMVar1->data == (void *)0x0) {
    iVar4 = -100;
  }
  else {
    iVar4 = -100;
    if ((long)(this->scale_data).c * (this->scale_data).cstep != 0) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int Normalize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}